

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O3

int_type __thiscall fmt::v5::internal::formatbuf<char>::overflow(formatbuf<char> *this,int_type ch)

{
  basic_buffer<char> *pbVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (ch != -1) {
    pbVar1 = this->buffer_;
    sVar2 = pbVar1->size_;
    uVar3 = sVar2 + 1;
    if (pbVar1->capacity_ < uVar3) {
      (**pbVar1->_vptr_basic_buffer)(pbVar1);
      sVar2 = pbVar1->size_;
      uVar3 = sVar2 + 1;
    }
    pbVar1->size_ = uVar3;
    pbVar1->ptr_[sVar2] = (char)ch;
  }
  return ch;
}

Assistant:

int_type overflow(int_type ch = traits_type::eof()) FMT_OVERRIDE {
    if (!traits_type::eq_int_type(ch, traits_type::eof()))
      buffer_.push_back(static_cast<Char>(ch));
    return ch;
  }